

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::append
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,
          vector<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  uint index;
  color_quad<unsigned_char,_int> *p;
  vector<crnlib::color_quad<unsigned_char,_int>_> *other_local;
  vector<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  if (other->m_size != 0) {
    index = this->m_size;
    p = operator[](other,0);
    insert(this,index,p,other->m_size);
  }
  return this;
}

Assistant:

vector& append(const vector& other)
        {
            if (other.m_size)
            {
                insert(m_size, &other[0], other.m_size);
            }
            return *this;
        }